

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_swap_tests.cpp
# Opt level: O2

void check_swap(json *j1,json *j2)

{
  json j4;
  json j3;
  SourceLineInfo local_d8;
  BinaryExpr<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  local_c8;
  AssertionHandler catchAssertionHandler;
  StringRef local_50;
  StringRef local_40;
  
  jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_copy
            (&j3,j1);
  jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_copy
            (&j4,j2);
  jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::swap(&j3,&j4);
  local_c8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x6522ad;
  local_c8.super_ITransientExpression.m_isBinaryExpression = true;
  local_c8.super_ITransientExpression.m_result = false;
  local_c8.super_ITransientExpression._10_6_ = 0;
  local_d8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/corelib/src/json_swap_tests.cpp"
  ;
  local_d8.line = 0x15;
  Catch::StringRef::StringRef(&local_40,"j1 == j4");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_c8,&local_d8,local_40,ContinueOnFailure);
  local_d8.file = (char *)j1;
  Catch::ExprLhs<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>::
  operator==(&local_c8,
             (ExprLhs<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>
              *)&local_d8,&j4);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_c8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_c8.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_c8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x6522ad;
  local_c8.super_ITransientExpression.m_isBinaryExpression = true;
  local_c8.super_ITransientExpression.m_result = false;
  local_c8.super_ITransientExpression._10_6_ = 0;
  local_d8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/corelib/src/json_swap_tests.cpp"
  ;
  local_d8.line = 0x16;
  Catch::StringRef::StringRef(&local_50,"j2 == j3");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_c8,&local_d8,local_50,ContinueOnFailure);
  local_d8.file = (char *)j2;
  Catch::ExprLhs<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>::
  operator==(&local_c8,
             (ExprLhs<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>
              *)&local_d8,&j3);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_c8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_c8.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json(&j4);
  jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json(&j3);
  return;
}

Assistant:

void check_swap(const json& j1, const json& j2)
{
    json j3 = j1;
    json j4 = j2;

    j3.swap(j4);
    CHECK(j1 == j4);
    CHECK(j2 == j3);
}